

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O0

int parseConvertElement(mpt_convertable *conv,mpt_type_t type,void *dest)

{
  ushort **ppuVar1;
  _mpt_vptr_metatype *p_Var2;
  mpt_convertable *local_68;
  size_t local_60;
  size_t klen;
  char *key;
  char *sep;
  iovec *vec;
  _mpt_vptr_metatype *p_Stack_38;
  int len;
  char *txt;
  mpt_parseIterator *it;
  void *dest_local;
  mpt_type_t type_local;
  mpt_convertable *conv_local;
  
  txt = (char *)(conv + -2);
  p_Stack_38 = (_mpt_vptr_metatype *)conv[4]._vptr;
  if (p_Stack_38 == (_mpt_vptr_metatype *)0x0) {
    conv_local._4_4_ = 0;
  }
  else {
    if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
      *(undefined1 *)&(conv[6]._vptr)->convert = *(undefined1 *)&conv[7]._vptr;
    }
    if (*(char *)&(p_Stack_38->convertable).convert == '\0') {
      if (type == 0x73) {
        if (dest != (void *)0x0) {
          *(undefined8 *)dest = 0;
        }
        conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
        conv_local._4_4_ = 0x73;
      }
      else {
        if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
          conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
        }
        conv_local._4_4_ = -0x10;
      }
    }
    else {
      it = (mpt_parseIterator *)dest;
      type_local = (mpt_type_t)conv;
      if (type == 0x73) {
        dest_local = (void *)0x73;
        while (ppuVar1 = __ctype_b_loc(),
              ((*ppuVar1)[(int)*(char *)&(p_Stack_38->convertable).convert] & 0x2000) != 0) {
          p_Stack_38 = (_mpt_vptr_metatype *)((long)&(p_Stack_38->convertable).convert + 1);
        }
        if (it != (mpt_parseIterator *)0x0) {
          (it->_mt)._vptr = p_Stack_38;
        }
        txt[0x40] = '\0';
        txt[0x41] = '\0';
        txt[0x42] = '\0';
        txt[0x43] = '\0';
        txt[0x44] = '\0';
        txt[0x45] = '\0';
        txt[0x46] = '\0';
        txt[0x47] = '\0';
        conv_local._4_4_ = 0x73;
      }
      else if (type == 0x43) {
        dest_local = (void *)0x43;
        while (ppuVar1 = __ctype_b_loc(),
              ((*ppuVar1)[(int)*(char *)&(p_Stack_38->convertable).convert] & 0x2000) != 0) {
          p_Stack_38 = (_mpt_vptr_metatype *)((long)&(p_Stack_38->convertable).convert + 1);
        }
        while (ppuVar1 = __ctype_b_loc(),
              ((*ppuVar1)[(int)*(char *)&(p_Stack_38->convertable).convert] & 0x2000) == 0) {
          p_Stack_38 = (_mpt_vptr_metatype *)((long)&(p_Stack_38->convertable).convert + 1);
        }
        *(_mpt_vptr_metatype **)(txt + 0x40) = p_Stack_38;
        txt[0x48] = *(char *)&(p_Stack_38->convertable).convert;
        **(undefined1 **)(txt + 0x40) = 0;
        if (it != (mpt_parseIterator *)0x0) {
          (it->_mt)._vptr = *(_mpt_vptr_metatype **)(txt + 0x30);
          (it->_it)._vptr = (_mpt_vptr_iterator *)((long)p_Stack_38 - *(long *)(txt + 0x30));
        }
        conv_local._4_4_ = 0x73;
      }
      else {
        dest_local = (void *)type;
        if (type == 0x6b) {
          key = (char *)(conv + 8);
          local_68 = (mpt_convertable *)key;
          if (*(char *)&((mpt_convertable *)key)->_vptr == '\0') {
            local_68 = (mpt_convertable *)0x0;
          }
          p_Var2 = (_mpt_vptr_metatype *)
                   mpt_convert_key((char **)&stack0xffffffffffffffc8,(char *)local_68,&local_60);
          if (p_Var2 == (_mpt_vptr_metatype *)0x0) {
            if (*(long *)(txt + 0x40) != 0) {
              txt[0x40] = '\0';
              txt[0x41] = '\0';
              txt[0x42] = '\0';
              txt[0x43] = '\0';
              txt[0x44] = '\0';
              txt[0x45] = '\0';
              txt[0x46] = '\0';
              txt[0x47] = '\0';
            }
            return -2;
          }
          if (it != (mpt_parseIterator *)0x0) {
            (it->_mt)._vptr = p_Var2;
          }
          vec._4_4_ = (int)p_Stack_38 - (int)*(undefined8 *)(txt + 0x30);
        }
        else {
          vec._4_4_ = mpt_convert_string((char *)conv[4]._vptr,type,dest);
          if (vec._4_4_ < 0) {
            return vec._4_4_;
          }
        }
        *(long *)(txt + 0x40) = *(long *)(txt + 0x30) + (long)vec._4_4_;
        if (*(ulong *)(txt + 0x40) < *(ulong *)(txt + 0x38)) {
          txt[0x48] = **(char **)(txt + 0x40);
          **(undefined1 **)(txt + 0x40) = 0;
        }
        else {
          txt[0x40] = '\0';
          txt[0x41] = '\0';
          txt[0x42] = '\0';
          txt[0x43] = '\0';
          txt[0x44] = '\0';
          txt[0x45] = '\0';
          txt[0x46] = '\0';
          txt[0x47] = '\0';
        }
        conv_local._4_4_ = 0x73;
      }
    }
  }
  return conv_local._4_4_;
}

Assistant:

static int parseConvertElement(MPT_INTERFACE(convertable) *conv, MPT_TYPE(type) type, void *dest)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, conv, elem._conv);
	const char *txt;
	int len;
	
	/* indicate consumed value */
	if (!(txt = it->val)) {
		return 0;
	}
	/* reset value end indicator */
	if (it->restore) {
		*it->restore = it->save;
	}
	if (!*txt) {
		if (type == 's') {
			if (dest) ((char **) dest)[0] = 0;
			it->restore = 0;
			return 's';
		}
		if (it->restore) {
			it->restore = 0;
		}
		return MPT_ERROR(MissingData);
	}
	/* return full remaining data */
	if (type == 's') {
		while (isspace(*txt)) ++txt;
		if (dest) *((const char **) dest) = txt;
		it->restore = 0;
		return 's';
	}
	if (type == MPT_type_toVector('c')) {
		while (isspace(*txt)) ++txt;
		while (!isspace(*txt)) ++txt;
		it->restore = (char *) txt;
		it->save = *txt;
		*it->restore = 0;
		if (dest) {
			struct iovec *vec = dest;
			vec->iov_base = it->val;
			vec->iov_len = txt - it->val;
		}
		return 's';
	}
	/* consume next complete word */
	if (type == 'k') {
		const char *sep = (char *) (it + 1);
		const char *key;
		size_t klen;
		if (!(key = mpt_convert_key(&txt, *sep ? sep : 0, &klen))) {
			if (it->restore) {
				it->restore = 0;
			}
			return MPT_ERROR(BadValue);
		}
		if (dest) {
			((const char **) dest)[0] = key;
		}
		len = txt - it->val;
	}
	/* convert to target type */
	else if ((len = mpt_convert_string(it->val, type, dest)) < 0) {
		return len;
	}
	/* terminate consumed substring */
	it->restore = it->val + len;
	if (it->restore >= it->end) {
		it->restore = 0;
	} else {
		it->save = *it->restore;
		*it->restore = 0;
	}
	return 's';
}